

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufAdd(xmlBufPtr buf,xmlChar *str,size_t len)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  
  iVar1 = -1;
  if ((buf != (xmlBufPtr)0x0) && ((buf->flags & 7) == 0)) {
    if (len != 0) {
      if (str == (xmlChar *)0x0) {
        return -1;
      }
      uVar2 = (ulong)buf->compat_size;
      if ((uVar2 < 0x7fffffff) && (buf->size != uVar2)) {
        buf->size = uVar2;
      }
      uVar2 = (ulong)buf->compat_use;
      if ((uVar2 < 0x7fffffff) && (buf->use != uVar2)) {
        buf->use = uVar2;
      }
      if ((buf->size - buf->use < len) && (iVar1 = xmlBufGrowInternal(buf,len), iVar1 < 0)) {
        return -1;
      }
      memmove(buf->content + buf->use,str,len);
      sVar3 = len + buf->use;
      buf->use = sVar3;
      buf->content[sVar3] = '\0';
      uVar2 = buf->size;
      if (0x7ffffffe < uVar2) {
        uVar2 = 0x7fffffff;
      }
      buf->compat_size = (uint)uVar2;
      uVar2 = 0x7fffffff;
      if (buf->use < 0x7fffffff) {
        uVar2 = buf->use;
      }
      buf->compat_use = (uint)uVar2;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlBufAdd(xmlBufPtr buf, const xmlChar *str, size_t len) {
    if ((buf == NULL) || (BUF_ERROR(buf)) || (BUF_STATIC(buf)))
        return(-1);
    if (len == 0)
        return(0);
    if (str == NULL)
	return(-1);
    CHECK_COMPAT(buf)

    if (len > buf->size - buf->use) {
        if (xmlBufGrowInternal(buf, len) < 0)
            return(-1);
    }

    memmove(&buf->content[buf->use], str, len);
    buf->use += len;
    buf->content[buf->use] = 0;

    UPDATE_COMPAT(buf)
    return(0);
}